

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O0

bool __thiscall FileSystemUtils::Path::CreateDir(Path *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *__path;
  int error;
  undefined1 local_40 [8];
  Path parentpath;
  Path *this_local;
  
  parentpath.m_string.field_2._8_8_ = this;
  lVar3 = std::__cxx11::string::length();
  if (lVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = Exists(this);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      ParentPath((Path *)local_40,this);
      bVar1 = Exists((Path *)local_40);
      if (!bVar1) {
        CreateDir((Path *)local_40);
      }
      __path = (char *)std::__cxx11::string::c_str();
      iVar2 = mkdir(__path,0x1ff);
      this_local._7_1_ = iVar2 == 0;
      ~Path((Path *)local_40);
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool Path::CreateDir() const
	{
        if( m_string.length() == 0 )
        {
            return false;
        }
        if( Exists() )
        {
            return false;
        }

        // we may need to create the parent path recursively
        Path parentpath = ParentPath();
        if( !parentpath.Exists() )
        {
            parentpath.CreateDir();
        }

		int error = -1;
#ifdef _WIN32
		std::wstring temp = _Win32Utf8ToUtf16( m_string );
		error = _wmkdir( temp.c_str() );
#else
		error = mkdir( m_string.c_str(), 0777 );
#endif
		if( 0 == error )
		{
			return true;
		}
		return false;
	}